

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Start.cpp
# Opt level: O2

void __thiscall Start::StartGameNowKeno(Start *this,double *credits,uint *bet)

{
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  kenoVector;
  int iVar1;
  ostream *poVar2;
  char cVar3;
  Keno *this_00;
  string p;
  CreditField addCreditBeforeExit;
  Bet settingBet;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  myVectorInStart;
  Keno_HotAndCold hotAndCold;
  Keno playgame;
  undefined8 in_stack_ffffffffffffff08;
  char *pcVar4;
  pointer pvVar5;
  char local_e0 [16];
  CreditField local_d0;
  SelectGame local_c8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_a8;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_88;
  Keno_HotAndCold local_70;
  Keno local_58;
  
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar4 = local_e0;
  pvVar5 = (pointer)0x0;
  local_e0[0] = '\0';
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_88,&local_a8);
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pcVar4;
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff08;
  kenoVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pvVar5;
  Keno::Keno(&local_58,kenoVector,*credits,(uint)&local_88);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_88);
  Keno_HotAndCold::Keno_HotAndCold(&local_70);
  while (1.0 <= *credits) {
    if (*credits < (double)*bet) {
      *bet = 1;
      poVar2 = std::operator<<((ostream *)&std::cout,"Changing Bet to min: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2," Euro!");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'p\' to Start a Game!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'e\' to Change the Bet!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'i\' to see the Paytable!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'c\' to Cashout!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'g\' to see the Gamble Info Screen!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'a\' to add credit!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"Press \'q\' for More Games!");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator<<((ostream *)&std::cout,"Current Credit: ");
    poVar2 = std::ostream::_M_insert<double>(*credits);
    poVar2 = std::operator<<(poVar2," Euro!");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "********************************************************************************************************************"
                            );
    std::endl<char,std::char_traits<char>>(poVar2);
    std::operator>>((istream *)&std::cin,(string *)&stack0xffffffffffffff10);
    cVar3 = *pcVar4;
    if (pvVar5 == (pointer)0x1 && cVar3 == 'p') {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      *credits = *credits - (double)*bet;
      this_00 = &local_58;
      Keno::checkForHits(this_00,credits,bet);
      checkForCreditsAndBet((Start *)this_00,credits,bet);
      outputCreditsAndBetCurrent((Start *)this_00,credits,bet);
      cVar3 = *pcVar4;
    }
    if (pvVar5 == (pointer)0x1 && cVar3 == 'e') {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Bet::Bet((Bet *)&local_c8,*bet,*credits);
      Bet::selectBetKeno((Bet *)&local_c8,bet,credits);
      Bet::~Bet((Bet *)&local_c8);
      cVar3 = *pcVar4;
    }
    if ((cVar3 == 'i') && (pvVar5 == (pointer)0x1)) {
      iVar1 = system("CLS");
      if (iVar1 != 0) {
        system("clear");
      }
      Keno::infoPageKeno(&local_58);
      cVar3 = *pcVar4;
    }
    if ((cVar3 == 'c') && (pvVar5 == (pointer)0x1)) {
      if (*credits <= 0.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Nothing to cashout!");
        std::endl<char,std::char_traits<char>>(poVar2);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Cashout...");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::operator<<((ostream *)&std::cout,"Handpay! Call Attendant! ");
        poVar2 = std::ostream::_M_insert<double>(*credits);
        poVar2 = std::operator<<(poVar2," Euro!");
        std::endl<char,std::char_traits<char>>(poVar2);
        *credits = 0.0;
      }
    }
    cVar3 = *pcVar4;
    if (pvVar5 == (pointer)0x1 && cVar3 == 'g') {
      Gamble::Gamble((Gamble *)&local_c8);
      Gamble::GambleInfoScreen((Gamble *)&local_c8);
      Gamble::~Gamble((Gamble *)&local_c8);
      cVar3 = *pcVar4;
    }
    if (pvVar5 == (pointer)0x1 && cVar3 == 'a') {
      CreditField::CreditField((CreditField *)&local_c8);
      CreditField::AddCredit((CreditField *)&local_c8,credits);
      CreditField::~CreditField((CreditField *)&local_c8);
      cVar3 = *pcVar4;
    }
    if ((cVar3 == 'q') && (pvVar5 == (pointer)0x1)) {
      SelectGame::SelectGame(&local_c8);
      SelectGame::selectGame_Welcome(&local_c8);
      SelectGame::selectGame_Games(&local_c8);
      SelectGame::selectGame_Option(&local_c8,credits);
      SelectGame::~SelectGame(&local_c8);
    }
    if (*credits <= 1.0 && *credits != 1.0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"No More Credits To Play on Min Bet! :(");
      std::endl<char,std::char_traits<char>>(poVar2);
      CreditField::CreditField(&local_d0);
      CreditField::AddCredit(&local_d0,credits);
      if (*credits <= 1.0 && *credits != 1.0) {
        poVar2 = std::operator<<((ostream *)&std::cout,"You need to add atleast 1 Euro!");
        std::endl<char,std::char_traits<char>>(poVar2);
        std::operator<<((ostream *)&std::cout,"Cashout: ");
        poVar2 = std::ostream::_M_insert<double>(*credits);
        poVar2 = std::operator<<(poVar2," Euro.");
        std::endl<char,std::char_traits<char>>(poVar2);
        *credits = 0.0;
        SelectGame::SelectGame(&local_c8);
        SelectGame::selectGame_Welcome(&local_c8);
        SelectGame::selectGame_Games(&local_c8);
        SelectGame::selectGame_Option(&local_c8,credits);
        SelectGame::~SelectGame(&local_c8);
      }
      CreditField::~CreditField(&local_d0);
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::clear(&local_a8);
  }
  Keno_HotAndCold::~Keno_HotAndCold(&local_70);
  Keno::~Keno(&local_58);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff10);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void Start::StartGameNowKeno(double& credits, unsigned int& bet) {

	std::vector<std::vector<int>>myVectorInStart;
	//myVectorInStart = getVectorMatrix();
	std::string p;
	Keno playgame(myVectorInStart,credits,bet);
	unsigned int minBet = 1;
	Keno_HotAndCold hotAndCold;
	//PaytableSuperFire paytableForGame(myVectorInStart, credits, bet);
	while (credits >= 1) {
		if (credits < bet && credits >= 1) {
			bet = minBet;
			std::cout << "Changing Bet to min: " << bet << " Euro!" << std::endl;
		}
		std::cout << "********************************************************************************************************************" << std::endl;
		std::cout << "Press 'p' to Start a Game!" << std::endl;
		std::cout << "Press 'e' to Change the Bet!" << std::endl;
		std::cout << "Press 'i' to see the Paytable!" << std::endl;
		std::cout << "Press 'c' to Cashout!" << std::endl;
		std::cout << "Press 'g' to see the Gamble Info Screen!" << std::endl;
		std::cout << "Press 'a' to add credit!" << std::endl;
		std::cout << "Press 'q' for More Games!" << std::endl;
		//std::cout << "Press 'h' for Hot and Cold Numbers!" << std::endl;
		std::cout << "Current Credit: " << credits << " Euro!" << std::endl;
		std::cout << "********************************************************************************************************************" << std::endl;

		std::cin >> p;
		//new code here for safety
		/*while(p.size() > 1) {
			std::cin >> p;
		}*/
		if (p[0] == 'p' && p.size() == 1) {
			//clears screen
			if (system("CLS")) system("clear");
			
			takeCreditsWithBet(credits, bet);
			playgame.checkForHits(credits,bet);
			//RandomNumbersInMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl; std::cout << " " << std::endl;
			//outPutMatrix(myVectorInStart);
			//std::cout << "---------------------------------------------" << std::endl;
			checkForCreditsAndBet(credits, bet);
			outputCreditsAndBetCurrent(credits, bet);
			//paytableForGame.PaytableSuperFireWin(myVectorInStart, credits, bet);
		}
		if (p[0] == 'e' && p.size() == 1) {
			if (system("CLS")) system("clear");
			Bet settingBet(bet, credits);
			settingBet.selectBetKeno(bet, credits);
		}
		if (p[0] == 'i' && p.size() == 1) {
			if (system("CLS")) system("clear");
			playgame.infoPageKeno();
		}
		if (p[0] == 'c' && p.size() == 1) {
			if (credits > 0.0) {
				std::cout << "Cashout..." << std::endl;
				std::cout << "Handpay! Call Attendant! " << credits << " Euro!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
				credits = 0;
			}
			else {
				std::cout << "Nothing to cashout!" << std::endl;
				//std::chrono::seconds duration(3);
				//std::this_thread::sleep_for(duration);
			}
			//exit(0);
		}
		if (p[0] == 'g' && p.size() == 1) {

			Gamble gambleInfoScreen;
			gambleInfoScreen.GambleInfoScreen();
		}
		if (p[0] == 'a' && p.size() == 1) {
			CreditField addCredit;
			addCredit.AddCredit(credits);
		}
		if (p[0] == 'q' && p.size() == 1) {
			SelectGame selectgame;
			selectgame.selectGame_Welcome();
			selectgame.selectGame_Games();

			//choosing a game
			selectgame.selectGame_Option(credits);
		}
		/*if (p[0] == 'h' && p.size() == 1) {
			if (system("CLS")) system("clear");
			hotAndCold.infoHotAndCold();
		}*/
		if (credits < 1) {
			std::cout << "No More Credits To Play on Min Bet! :(" << std::endl;
			CreditField addCreditBeforeExit;
			addCreditBeforeExit.AddCredit(credits);
			if (credits < 1) {
				std::cout << "You need to add atleast 1 Euro!" << std::endl;
				std::cout << "Cashout: " << credits << " Euro." << std::endl;
				credits = 0;
				//Sleep(2000);
				SelectGame selectgame;
				selectgame.selectGame_Welcome();
				selectgame.selectGame_Games();

				//choosing a game
				selectgame.selectGame_Option(credits);
			}
		}

		myVectorInStart.clear();
	}
}